

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineFramebufferAttachmentTests.cpp
# Opt level: O2

void vkt::pipeline::anon_unknown_0::addAttachmentTestCasesWithFunctions(TestCaseGroup *group)

{
  TestContext *testCtx;
  char *__s;
  ostream *poVar1;
  TestNode *node;
  long lVar2;
  allocator<char> local_862;
  allocator<char> local_861;
  TestNode *local_860;
  CaseDef_conflict1 local_858;
  long local_830;
  string local_828;
  char *local_808 [4];
  string local_7e8;
  CaseDef_conflict1 local_7c8;
  undefined8 local_7a4;
  undefined8 uStack_79c;
  undefined8 local_794;
  undefined8 uStack_78c;
  undefined1 local_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined1 local_760;
  undefined8 local_75c;
  undefined8 uStack_754;
  undefined8 local_74c;
  undefined8 uStack_744;
  undefined1 local_73c;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined1 local_718;
  undefined8 local_714;
  undefined8 uStack_70c;
  undefined8 local_704;
  undefined8 uStack_6fc;
  undefined1 local_6f4;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined1 local_6d0;
  undefined8 local_6cc;
  undefined8 uStack_6c4;
  undefined8 local_6bc;
  undefined8 uStack_6b4;
  undefined1 local_6ac;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined1 local_688;
  undefined8 local_684;
  undefined8 uStack_67c;
  undefined8 local_674;
  undefined8 uStack_66c;
  undefined1 local_664;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined1 local_640;
  undefined8 local_63c;
  undefined8 uStack_634;
  undefined8 local_62c;
  undefined8 uStack_624;
  undefined1 local_61c;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined1 local_5f8;
  undefined8 local_5f4;
  undefined8 uStack_5ec;
  undefined8 local_5e4;
  undefined8 uStack_5dc;
  undefined1 local_5d4;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined1 local_5b0;
  undefined8 local_5ac;
  undefined8 uStack_5a4;
  undefined8 local_59c;
  undefined8 uStack_594;
  undefined1 local_58c;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined1 local_568;
  undefined8 local_564;
  undefined8 uStack_55c;
  undefined8 local_554;
  undefined8 uStack_54c;
  undefined1 local_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 local_520;
  undefined8 local_51c;
  undefined8 uStack_514;
  undefined8 local_50c;
  undefined8 uStack_504;
  undefined1 local_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined1 local_4d8;
  undefined8 local_4d4;
  undefined8 uStack_4cc;
  undefined8 local_4c4;
  undefined8 uStack_4bc;
  undefined1 local_4b4;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined1 local_490;
  undefined8 local_48c;
  undefined8 uStack_484;
  undefined8 local_47c;
  undefined8 uStack_474;
  undefined1 local_46c;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined1 local_448;
  undefined8 local_444;
  undefined8 uStack_43c;
  undefined8 local_434;
  undefined8 uStack_42c;
  undefined1 local_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400;
  undefined8 local_3fc;
  undefined8 uStack_3f4;
  undefined8 local_3ec;
  undefined8 uStack_3e4;
  undefined1 local_3dc;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined1 local_3b8;
  undefined8 local_3b4;
  undefined8 uStack_3ac;
  undefined8 local_3a4;
  undefined8 uStack_39c;
  undefined1 local_394;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined1 local_370;
  undefined8 local_36c;
  undefined8 uStack_364;
  undefined8 local_35c;
  undefined8 uStack_354;
  undefined1 local_34c;
  string s;
  ostringstream str;
  CaseDef_conflict1 local_54;
  
  local_7c8.imageType = VK_IMAGE_VIEW_TYPE_1D;
  local_7c8.renderSize.m_data[0] = 0x20;
  local_7c8.renderSize.m_data[1] = 1;
  local_7c8.renderSize.m_data[2] = 1;
  local_7c8.attachmentSize.m_data[0] = 0x40;
  local_7c8.attachmentSize.m_data[1] = 1;
  local_7c8.attachmentSize.m_data[2] = 1;
  local_7c8.numLayers = 1;
  local_7c8.multisample = false;
  local_7a4 = 0x2000000000;
  uStack_79c = 0x100000001;
  local_794 = 0x100000030;
  uStack_78c = 0x100000001;
  local_784 = 0;
  local_780 = 0x2000000000;
  uStack_778 = 0x100000001;
  local_770 = 0x100000027;
  uStack_768 = 0x100000001;
  local_760 = 0;
  local_75c = 0x1300000000;
  uStack_754 = 0x100000001;
  local_74c = 0x100000020;
  uStack_744 = 0x100000001;
  local_73c = 0;
  local_738 = 0x2000000004;
  uStack_730 = 0x100000001;
  local_728 = 0x100000040;
  uStack_720 = 0x400000001;
  local_718 = 0;
  local_714 = 0x2000000004;
  uStack_70c = 0x100000001;
  local_704 = 0x100000030;
  uStack_6fc = 0x400000001;
  local_6f4 = 0;
  local_6f0 = 0x2000000004;
  uStack_6e8 = 0x100000001;
  local_6e0 = 0x100000027;
  uStack_6d8 = 0x400000001;
  local_6d0 = 0;
  local_6cc = 0x1300000004;
  uStack_6c4 = 0x100000001;
  local_6bc = 0x100000020;
  uStack_6b4 = 0x400000001;
  local_6ac = 0;
  local_6a8 = 0x2000000001;
  uStack_6a0 = 0x100000020;
  local_698 = 0x4000000040;
  uStack_690 = 0x100000001;
  local_688 = 0;
  local_684 = 0x2000000001;
  uStack_67c = 0x100000020;
  local_674 = 0x3000000030;
  uStack_66c = 0x100000001;
  local_664 = 0;
  local_660 = 0x2000000001;
  uStack_658 = 0x100000020;
  local_650 = 0x2900000027;
  uStack_648 = 0x100000001;
  local_640 = 0;
  local_63c = 0x1300000001;
  uStack_634 = 0x10000001b;
  local_62c = 0x2000000020;
  uStack_624 = 0x100000001;
  local_61c = 0;
  local_618 = 0x2000000005;
  uStack_610 = 0x100000020;
  local_608 = 0x4000000040;
  uStack_600 = 0x400000001;
  local_5f8 = 0;
  local_5f4 = 0x2000000005;
  uStack_5ec = 0x100000020;
  local_5e4 = 0x3000000030;
  uStack_5dc = 0x400000001;
  local_5d4 = 0;
  local_5d0 = 0x2000000005;
  uStack_5c8 = 0x100000020;
  local_5c0 = 0x2900000027;
  uStack_5b8 = 0x400000001;
  local_5b0 = 0;
  local_5ac = 0x1300000005;
  uStack_5a4 = 0x10000001b;
  local_59c = 0x2000000020;
  uStack_594 = 0x400000001;
  local_58c = 0;
  local_588 = 0x2000000003;
  uStack_580 = 0x100000020;
  local_578 = 0x4000000040;
  uStack_570 = 0x600000001;
  local_568 = 0;
  local_564 = 0x2000000003;
  uStack_55c = 0x100000020;
  local_554 = 0x3000000030;
  uStack_54c = 0x600000001;
  local_544 = 0;
  local_540 = 0x2000000003;
  uStack_538 = 0x100000020;
  local_530 = 0x2900000027;
  uStack_528 = 0x600000001;
  local_520 = 0;
  local_51c = 0x1300000003;
  uStack_514 = 0x10000001b;
  local_50c = 0x2000000020;
  uStack_504 = 0x600000001;
  local_4fc = 0;
  local_4f8 = 0x2000000006;
  uStack_4f0 = 0x100000020;
  local_4e8 = 0x4000000040;
  uStack_4e0 = 0xc00000001;
  local_4d8 = 0;
  local_4d4 = 0x2000000006;
  uStack_4cc = 0x100000020;
  local_4c4 = 0x3000000030;
  uStack_4bc = 0xc00000001;
  local_4b4 = 0;
  local_4b0 = 0x2000000006;
  uStack_4a8 = 0x100000020;
  local_4a0 = 0x2900000027;
  uStack_498 = 0xc00000001;
  local_490 = 0;
  local_48c = 0x1300000006;
  uStack_484 = 0x10000001b;
  local_47c = 0x2000000020;
  uStack_474 = 0xc00000001;
  local_46c = 0;
  local_468 = 0x2000000001;
  uStack_460 = 0x100000020;
  local_458 = 0x4000000040;
  uStack_450 = 0x100000001;
  local_448 = 1;
  local_444 = 0x2000000001;
  uStack_43c = 0x100000020;
  local_434 = 0x3000000030;
  uStack_42c = 0x100000001;
  local_424 = 1;
  local_420 = 0x2000000001;
  uStack_418 = 0x100000020;
  local_410 = 0x2900000027;
  uStack_408 = 0x100000001;
  local_400 = 1;
  local_3fc = 0x1300000001;
  uStack_3f4 = 0x10000001b;
  local_3ec = 0x2000000020;
  uStack_3e4 = 0x100000001;
  local_3dc = 1;
  local_3d8 = 0x2000000005;
  uStack_3d0 = 0x100000020;
  local_3c8 = 0x4000000040;
  uStack_3c0 = 0x400000001;
  local_3b8 = 1;
  local_3b4 = 0x2000000005;
  uStack_3ac = 0x100000020;
  local_3a4 = 0x3000000030;
  uStack_39c = 0x400000001;
  local_394 = 1;
  local_390 = 0x2000000005;
  uStack_388 = 0x100000020;
  local_380 = 0x2900000027;
  uStack_378 = 0x400000001;
  local_370 = 1;
  local_36c = 0x1300000005;
  uStack_364 = 0x10000001b;
  local_35c = 0x2000000020;
  uStack_354 = 0x400000001;
  local_34c = 1;
  lVar2 = 0;
  local_860 = &group->super_TestNode;
  while (lVar2 != 0x480) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    __s = ::vk::getImageViewTypeName
                    (*(VkImageViewType *)((long)local_7c8.renderSize.m_data + lVar2 + -4));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,__s,(allocator<char> *)&local_858);
    std::__cxx11::string::substr((ulong)&local_858,(ulong)&s);
    de::toLower(&local_828,(string *)&local_858);
    std::__cxx11::string::~string((string *)&local_858);
    std::__cxx11::string::~string((string *)&s);
    std::operator<<((ostream *)&str,local_828._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_828);
    std::operator<<((ostream *)&str,"_");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    std::ostream::operator<<
              ((Args_conflict1 *)&s,*(int *)((long)local_7c8.renderSize.m_data + lVar2));
    if (1 < *(int *)((long)local_7c8.renderSize.m_data + lVar2 + 4)) {
      poVar1 = std::operator<<((ostream *)&s,"x");
      std::ostream::operator<<(poVar1,*(int *)((long)local_7c8.renderSize.m_data + lVar2 + 4));
    }
    if (1 < *(int *)((long)local_7c8.renderSize.m_data + lVar2 + 8)) {
      poVar1 = std::operator<<((ostream *)&s,"x");
      std::ostream::operator<<(poVar1,*(int *)((long)local_7c8.renderSize.m_data + lVar2 + 8));
    }
    poVar1 = std::operator<<((ostream *)&s,"_");
    std::ostream::operator<<(poVar1,*(int *)((long)local_7c8.attachmentSize.m_data + lVar2));
    if (1 < *(int *)((long)local_7c8.attachmentSize.m_data + lVar2 + 4)) {
      poVar1 = std::operator<<((ostream *)&s,"x");
      std::ostream::operator<<(poVar1,*(int *)((long)local_7c8.attachmentSize.m_data + lVar2 + 4));
    }
    if (1 < *(int *)((long)local_7c8.attachmentSize.m_data + lVar2 + 8)) {
      poVar1 = std::operator<<((ostream *)&s,"x");
      std::ostream::operator<<(poVar1,*(int *)((long)local_7c8.attachmentSize.m_data + lVar2 + 8));
    }
    if (1 < *(uint *)((long)(&local_7c8.attachmentSize + 1) + lVar2)) {
      poVar1 = std::operator<<((ostream *)&s,"_");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    std::operator<<((ostream *)&str,(string *)&local_858);
    std::__cxx11::string::~string((string *)&local_858);
    if (*(char *)((long)(&local_7c8.attachmentSize + 1) + lVar2 + 4) == '\x01') {
      std::operator<<((ostream *)&str,"_ms");
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,local_808[0],&local_861)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_828,"",&local_862);
    local_830 = lVar2;
    CaseDef::CaseDef((CaseDef *)&local_54,
                     (CaseDef_conflict1 *)((long)local_7c8.renderSize.m_data + lVar2 + -4));
    testCtx = local_860->m_testCtx;
    CaseDef::CaseDef((CaseDef *)&local_858,&local_54);
    node = (TestNode *)operator_new(0xa8);
    CaseDef::CaseDef((CaseDef *)&str,&local_858);
    s._M_dataplus._M_p = (pointer)test;
    CaseDef::CaseDef((CaseDef *)&s._M_string_length,(CaseDef_conflict1 *)&str);
    TestCase::TestCase((TestCase *)node,testCtx,NODETYPE_SELF_VALIDATE,&local_7e8,&local_828);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bfcc40;
    node[1]._vptr_TestNode = (_func_int **)initColorPrograms;
    FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>::Args::Args
              ((Args *)&node[1].m_testCtx,(Args_conflict1 *)&s);
    tcu::TestNode::addChild(local_860,node);
    std::__cxx11::string::~string((string *)&local_828);
    std::__cxx11::string::~string((string *)&local_7e8);
    std::__cxx11::string::~string((string *)local_808);
    lVar2 = local_830 + 0x24;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"no_attachments",(allocator<char> *)&local_858);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"",(allocator<char> *)&local_828);
  addFunctionCaseWithPrograms<bool>
            ((TestCaseGroup *)local_860,&s,(string *)&str,initImagePrograms,testNoAtt,false);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"no_attachments_ms",(allocator<char> *)&local_858);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"",(allocator<char> *)&local_828);
  addFunctionCaseWithPrograms<bool>
            ((TestCaseGroup *)local_860,&s,(string *)&str,initImagePrograms,testNoAtt,true);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void addAttachmentTestCasesWithFunctions (tcu::TestCaseGroup* group)
{

	// Add test cases for attachment strictly sizes larger than the framebuffer
	const CaseDef	caseDef[]	=
	{
		// Single-sample test cases
		{ VK_IMAGE_VIEW_TYPE_1D,			IVec3(32, 1, 1),	IVec3(64, 1, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_1D,			IVec3(32, 1, 1),	IVec3(48, 1, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_1D,			IVec3(32, 1, 1),	IVec3(39, 1, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_1D,			IVec3(19, 1, 1),	IVec3(32, 1, 1),	1,		false },

		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		IVec3(32, 1, 1),	IVec3(64, 1, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		IVec3(32, 1, 1),	IVec3(48, 1, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		IVec3(32, 1, 1),	IVec3(39, 1, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		IVec3(19, 1, 1),	IVec3(32, 1, 1),	4,		false },

		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(64, 64, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(48, 48, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(39, 41, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(19, 27, 1),	IVec3(32, 32, 1),	1,		false },

		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(64, 64, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(48, 48, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(39, 41, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(19, 27, 1),	IVec3(32, 32, 1),	4,		false },

		{ VK_IMAGE_VIEW_TYPE_CUBE,			IVec3(32, 32, 1),	IVec3(64, 64, 1),	6,		false },
		{ VK_IMAGE_VIEW_TYPE_CUBE,			IVec3(32, 32, 1),	IVec3(48, 48, 1),	6,		false },
		{ VK_IMAGE_VIEW_TYPE_CUBE,			IVec3(32, 32, 1),	IVec3(39, 41, 1),	6,		false },
		{ VK_IMAGE_VIEW_TYPE_CUBE,			IVec3(19, 27, 1),	IVec3(32, 32, 1),	6,		false },

		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	IVec3(32, 32, 1),	IVec3(64, 64, 1),	6*2,	false },
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	IVec3(32, 32, 1),	IVec3(48, 48, 1),	6*2,	false },
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	IVec3(32, 32, 1),	IVec3(39, 41, 1),	6*2,	false },
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	IVec3(19, 27, 1),	IVec3(32, 32, 1),	6*2,	false },

		// Multi-sample test cases
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(64, 64, 1),	1,		true },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(48, 48, 1),	1,		true },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(39, 41, 1),	1,		true },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(19, 27, 1),	IVec3(32, 32, 1),	1,		true },

		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(64, 64, 1),	4,		true },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(48, 48, 1),	4,		true },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(39, 41, 1),	4,		true },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(19, 27, 1),	IVec3(32, 32, 1),	4,		true },
	};

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(caseDef); ++sizeNdx)
		addFunctionCaseWithPrograms(group, getTestCaseString(caseDef[sizeNdx]).c_str(), "", initColorPrograms, test, caseDef[sizeNdx]);

	// Add tests for the case where there are no color attachments but the
	// fragment shader writes to an image via imageStore().
	addFunctionCaseWithPrograms(group, "no_attachments", "", initImagePrograms, testNoAtt, false);
	addFunctionCaseWithPrograms(group, "no_attachments_ms", "", initImagePrograms, testNoAtt, true);
}